

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O1

void avl_remove(avl_tree *tree,avl_node *node)

{
  avl_node *paVar1;
  avl_node *paVar2;
  avl_node *paVar3;
  avl_node *paVar4;
  list_entity *plVar5;
  list_entity *plVar6;
  avl_node **ppaVar7;
  
  if (node->follower == false) {
    if (((tree->allow_dups == true) && ((avl_node *)(tree->list_head).prev != node)) &&
       (paVar1 = (avl_node *)(node->list).next, paVar1->follower == true)) {
      paVar1->follower = false;
      paVar1->balance = node->balance;
      paVar2 = node->parent;
      paVar3 = node->left;
      paVar4 = node->right;
      paVar1->parent = paVar2;
      paVar1->left = paVar3;
      paVar1->right = paVar4;
      if (paVar2 == (avl_node *)0x0) {
        ppaVar7 = &tree->root;
      }
      else {
        ppaVar7 = &paVar2->right;
        if (paVar2->left == node) {
          ppaVar7 = &paVar2->left;
        }
      }
      *ppaVar7 = paVar1;
      if (paVar3 != (avl_node *)0x0) {
        paVar3->parent = paVar1;
      }
      if (paVar4 != (avl_node *)0x0) {
        paVar4->parent = paVar1;
      }
    }
    else {
      _avl_remove_worker(tree,node);
    }
  }
  plVar5 = (node->list).next;
  plVar6 = (node->list).prev;
  plVar6->next = plVar5;
  plVar5->prev = plVar6;
  (node->list).next = (list_entity *)0x0;
  (node->list).prev = (list_entity *)0x0;
  tree->count = tree->count - 1;
  return;
}

Assistant:

void
avl_remove(struct avl_tree *tree, struct avl_node *node) {
  struct avl_node *next;
  struct avl_node *parent;
  struct avl_node *left;
  struct avl_node *right;
  if (!node->follower) {
    if (tree->allow_dups && !list_is_last(&tree->list_head, &node->list) &&
        (next = list_next_element(node, list))->follower) {
      next->follower = false;
      next->balance = node->balance;

      parent = node->parent;
      left = node->left;
      right = node->right;

      next->parent = parent;
      next->left = left;
      next->right = right;

      if (parent == NULL)
        tree->root = next;

      else {
        if (node == parent->left)
          parent->left = next;

        else
          parent->right = next;
      }

      if (left != NULL)
        left->parent = next;

      if (right != NULL)
        right->parent = next;
    }

    else
      _avl_remove_worker(tree, node);
  }

  _avl_remove(tree, node);
}